

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

float __thiscall
Imath_3_2::Matrix44<float>::fastMinor
          (Matrix44<float> *this,int r0,int r1,int r2,int c0,int c1,int c2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  long lVar7;
  
  lVar7 = (long)c2;
  fVar1 = this->x[r1][c1];
  fVar2 = this->x[r2][lVar7];
  fVar3 = this->x[r1][lVar7];
  fVar4 = this->x[r2][c1];
  fVar5 = this->x[r2][c0];
  fVar6 = this->x[r1][c0];
  return (fVar6 * fVar4 - fVar5 * fVar1) * this->x[r0][lVar7] +
         (fVar1 * fVar2 - fVar4 * fVar3) * this->x[r0][c0] +
         (fVar3 * fVar5 - fVar2 * fVar6) * this->x[r0][c1];
}

Assistant:

IMATH_HOSTDEVICE constexpr inline T
Matrix44<T>::fastMinor (
    const int r0,
    const int r1,
    const int r2,
    const int c0,
    const int c1,
    const int c2) const IMATH_NOEXCEPT
{
    return x[r0][c0] * (x[r1][c1] * x[r2][c2] - x[r1][c2] * x[r2][c1]) +
           x[r0][c1] * (x[r1][c2] * x[r2][c0] - x[r1][c0] * x[r2][c2]) +
           x[r0][c2] * (x[r1][c0] * x[r2][c1] - x[r1][c1] * x[r2][c0]);
}